

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disasmtool.c
# Opt level: O2

INT32 regstr_to_idx(char *Reg)

{
  int iVar1;
  int *piVar2;
  INT32 i;
  long lVar3;
  
  lVar3 = 0;
  piVar2 = &regstr_to_idx_reg64_rel;
  while( true ) {
    if (lVar3 == 0x10) {
      return -1;
    }
    iVar1 = strcasecmp(Reg,(char *)((long)&regstr_to_idx_reg64_rel + (long)*piVar2));
    if (iVar1 == 0) break;
    lVar3 = lVar3 + 1;
    piVar2 = piVar2 + 1;
  }
  return (INT32)lVar3;
}

Assistant:

INT32
regstr_to_idx(
    _In_ const char *Reg
    )
{
    static const char *reg64[] =
    {
        "rax", "rcx", "rdx", "rbx", "rsp", "rbp", "rsi", "rdi",
        "r8",  "r9",  "r10", "r11", "r12", "r13", "r14", "r15"
    };

    for (INT32 i = 0; i < (INT32)ARRAYSIZE(reg64); i++)
    {
        if (!_stricmp(Reg, reg64[i]))
        {
            return i;
        }
    }

    return -1;
}